

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O0

Spectrum __thiscall CMU462::PathTracer::trace_ray(PathTracer *this,Ray *r)

{
  bool bVar1;
  uint uVar2;
  Spectrum *pSVar3;
  double *pdVar4;
  float fVar5;
  double dVar6;
  Spectrum SVar7;
  int local_310;
  Spectrum f;
  double cos_theta;
  Vector3D w_in;
  Spectrum light_L;
  int i;
  double scale;
  int num_light_samples;
  float pdf;
  float dist_to_light;
  undefined1 local_210 [8];
  Vector3D dir_to_light;
  undefined1 local_1e8 [8];
  InfiniteHemisphereLight light;
  undefined1 local_168 [8];
  Vector3D w_out;
  Matrix3x3 w2o;
  Matrix3x3 o2w;
  Vector3D hit_n;
  undefined1 local_90 [8];
  Vector3D hit_p;
  float local_6c;
  undefined1 local_58 [8];
  Intersection isect;
  Ray *r_local;
  PathTracer *this_local;
  Spectrum L_out;
  
  isect.bsdf = (BSDF *)r;
  StaticScene::Intersection::Intersection((Intersection *)local_58);
  uVar2 = (*(this->bvh->super_Aggregate).super_Primitive._vptr_Primitive[2])
                    (this->bvh,isect.bsdf,local_58);
  if ((uVar2 & 1) == 0) {
    Spectrum::Spectrum((Spectrum *)&this_local,0.0,0.0,0.0);
  }
  else {
    this_local = (PathTracer *)(**(code **)(*(long *)isect.n.z + 0x10))();
    Spectrum::Spectrum((Spectrum *)((long)&hit_p.z + 4),5.0,5.0,5.0);
    L_out.r = local_6c;
    this_local = stack0xffffffffffffff8c;
    pSVar3 = &(isect.bsdf)->rasterize_color;
    Vector3D::operator*((Vector3D *)&hit_n.z,(Vector3D *)&isect.bsdf[1].rasterize_color,
                        (double *)local_58);
    Vector3D::operator+((Vector3D *)local_90,(Vector3D *)pSVar3,(Vector3D *)&hit_n.z);
    Vector3D::Vector3D((Vector3D *)&o2w.entries[2].z,(Vector3D *)&isect.primitive);
    pdVar4 = &w2o.entries[2].z;
    Matrix3x3::Matrix3x3((Matrix3x3 *)pdVar4);
    make_coord_space((Matrix3x3 *)pdVar4,(Vector3D *)&isect.primitive);
    Matrix3x3::T((Matrix3x3 *)&w_out.z,(Matrix3x3 *)pdVar4);
    Vector3D::operator-((Vector3D *)&light.sampler,(Vector3D *)&(isect.bsdf)->rasterize_color,
                        (Vector3D *)local_90);
    Matrix3x3::operator*((Vector3D *)local_168,(Matrix3x3 *)&w_out.z,(Vector3D *)&light.sampler);
    Vector3D::normalize((Vector3D *)local_168);
    pSVar3 = (Spectrum *)((long)&dir_to_light.z + 4);
    Spectrum::Spectrum(pSVar3,5.0,5.0,5.0);
    StaticScene::InfiniteHemisphereLight::InfiniteHemisphereLight
              ((InfiniteHemisphereLight *)local_1e8,pSVar3);
    Vector3D::Vector3D((Vector3D *)local_210);
    bVar1 = StaticScene::InfiniteHemisphereLight::is_delta_light
                      ((InfiniteHemisphereLight *)local_1e8);
    if (bVar1) {
      local_310 = 1;
    }
    else {
      local_310 = (int)this->ns_area_light;
    }
    scale._0_4_ = local_310;
    for (light_L.g = 0.0; (int)light_L.g < scale._0_4_; light_L.g = (float)((int)light_L.g + 1)) {
      SVar7 = StaticScene::InfiniteHemisphereLight::sample_L
                        ((InfiniteHemisphereLight *)local_1e8,(Vector3D *)local_90,
                         (Vector3D *)local_210,(float *)&num_light_samples,
                         (float *)((long)&scale + 4));
      dVar6 = SVar7._0_8_;
      w_in.z = dVar6;
      Matrix3x3::operator*((Vector3D *)&cos_theta,(Matrix3x3 *)&w_out.z,(Vector3D *)local_210);
      fVar5 = SUB84(dVar6,0);
      stack0xfffffffffffffd88 = 0;
      f.g = 2.8026e-45;
      pdVar4 = Vector3D::operator[]((Vector3D *)&cos_theta,(int *)&f.g);
      std::max<double>((double *)&f.b,pdVar4);
      (*(code *)**(undefined8 **)isect.n.z)(isect.n.z,local_168,&cos_theta);
      f.r = fVar5;
    }
    StaticScene::InfiniteHemisphereLight::~InfiniteHemisphereLight
              ((InfiniteHemisphereLight *)local_1e8);
  }
  SVar7.b = L_out.r;
  SVar7._0_8_ = this_local;
  return SVar7;
}

Assistant:

Spectrum PathTracer::trace_ray(const Ray &r) {

    Intersection isect;

    if (!bvh->intersect(r, &isect)) {

      // log ray miss
#ifdef ENABLE_RAY_LOGGING
      log_ray_miss(r);
#endif

      // TODO:
      // If you have an environment map, return the Spectrum this ray
      // samples from the environment map. If you don't return black.

      return Spectrum(0,0,0);
    }

    // log ray hit
#ifdef ENABLE_RAY_LOGGING
    log_ray_hit(r, isect.t);
#endif

    Spectrum L_out = isect.bsdf->get_emission(); // Le

    // TODO :
    // Instead of initializing this value to a constant color, use the direct,
    // indirect lighting components calculated in the code below. The starter
    // code overwrites L_out by (.5,.5,.5) so that you can test your geometry
    // queries before you implement path tracing.
    L_out = Spectrum(5.f, 5.f, 5.f);

    Vector3D hit_p = r.o + r.d * isect.t;
    Vector3D hit_n = isect.n;

    // make a coordinate system for a hit point
    // with N aligned with the Z direction.
    Matrix3x3 o2w;
    make_coord_space(o2w, isect.n);
    Matrix3x3 w2o = o2w.T();

    // w_out points towards the source of the ray (e.g.,
    // toward the camera if this is a primary ray)
    Vector3D w_out = w2o * (r.o - hit_p);
    w_out.normalize();

    // TODO:
    // Extend the below code to compute the direct lighting for all the lights
    // in the scene, instead of just the dummy light we provided in part 1.

    InfiniteHemisphereLight light(Spectrum(5.f, 5.f, 5.f));
    //DirectionalLight light(Spectrum(5.f, 5.f, 5.f), Vector3D(1.0, -1.0, 0.0));

    Vector3D dir_to_light;
    float dist_to_light;
    float pdf;

    // no need to take multiple samples from a directional source
    int num_light_samples = light.is_delta_light() ? 1 : ns_area_light;

    // integrate light over the hemisphere about the normal
    double scale = 1.0 / num_light_samples;
    for (int i=0; i<num_light_samples; i++) {

      // returns a vector 'dir_to_light' that is a direction from
      // point hit_p to the point on the light source.  It also returns
      // the distance from point x to this point on the light source.
      // (pdf is the probability of randomly selecting the random
      // sample point on the light source -- more on this in part 2)
      Spectrum light_L = light.sample_L(hit_p, &dir_to_light, &dist_to_light, &pdf);

      // convert direction into coordinate space of the surface, where
      // the surface normal is [0 0 1]
      Vector3D w_in = w2o * dir_to_light;

      // note that computing dot(n,w_in) is simple
      // in surface coordinates since the normal is [0 0 1]
      double cos_theta = std::max(0.0, w_in[2]);

      // evaluate surface bsdf
      Spectrum f = isect.bsdf->f(w_out, w_in);

      // TODO:
      // Construct a shadow ray and compute whether the intersected surface is
      // in shadow and accumulate reflected radiance
    }

    // TODO:
    // Compute an indirect lighting estimate using pathtracing with Monte Carlo.
    // Note that Ray objects have a depth field now; you should use this to avoid
    // traveling down one path forever.

    return L_out;
  }